

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::PrepareXFB(AttributeFormatTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  unsigned_long uVar5;
  GLsizei size;
  Functions *gl;
  AttributeFormatTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_xfb);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x8d5);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_xfb);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x8d8);
  uVar5 = de::max<unsigned_long>(4,8);
  uVar5 = de::max<unsigned_long>(4,uVar5);
  uVar5 = de::max<unsigned_long>(4,uVar5);
  uVar5 = de::max<unsigned_long>(4,uVar5);
  uVar5 = de::max<unsigned_long>(2,uVar5);
  uVar5 = de::max<unsigned_long>(2,uVar5);
  uVar5 = de::max<unsigned_long>(2,uVar5);
  uVar5 = de::max<unsigned_long>(1,uVar5);
  uVar5 = de::max<unsigned_long>(1,uVar5);
  (**(code **)(lVar4 + 0x160))(0x8c8e,(long)(int)(uVar5 << 2),0,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBufferStorage call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x8ea);
  (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_bo_xfb);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBufferBase call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x8ed);
  return;
}

Assistant:

void AttributeFormatTest::PrepareXFB()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Buffer creation. */
	gl.genBuffers(1, &m_bo_xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	/* Calculating maximum size. */
	glw::GLsizei size = static_cast<glw::GLsizei>(
		de::max(sizeof(glw::GLubyte),
				de::max(sizeof(glw::GLbyte),
						de::max(sizeof(glw::GLushort),
								de::max(sizeof(glw::GLshort),
										de::max(sizeof(glw::GLhalf),
												de::max(sizeof(glw::GLint),
														de::max(sizeof(glw::GLuint),
																de::max(sizeof(glw::GLfixed),
																		de::max(sizeof(glw::GLfloat),
																				sizeof(glw::GLdouble)))))))))) *
		4 /* maximum number of components */);

	/* Preparing storage. */
	gl.bufferStorage(GL_TRANSFORM_FEEDBACK_BUFFER, size, NULL, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase call failed.");
}